

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O0

Test * ParserTestDefaultDefault::Create(void)

{
  Test *this;
  
  this = (Test *)operator_new(0x1e8);
  ParserTestDefaultDefault((ParserTestDefaultDefault *)this);
  g_current_test = this;
  return this;
}

Assistant:

TEST_F(ParserTest, DefaultDefault) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(
"rule cat\n  command = cat $in > $out\n"
"build a: cat foo\n"
"build b: cat foo\n"
"build c: cat foo\n"
"build d: cat foo\n"));

  string err;
  EXPECT_EQ(4u, state.DefaultNodes(&err).size());
  EXPECT_EQ("", err);
}